

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Stop_Freeze_PDU::operator==(Stop_Freeze_PDU *this,Stop_Freeze_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::ClockTime::operator!=(&this->m_RealWorldTime,&Value->m_RealWorldTime),
       !KVar1)) && (this->m_ui8Reason == Value->m_ui8Reason)) &&
     (this->m_ui8FrozenBehaviour == Value->m_ui8FrozenBehaviour)) {
    return this->m_ui32RequestID == Value->m_ui32RequestID;
  }
  return false;
}

Assistant:

KBOOL Stop_Freeze_PDU::operator == ( const Stop_Freeze_PDU & Value ) const
{
    if( Simulation_Management_Header::operator !=( Value ) )                   return false;
    if( m_RealWorldTime                        != Value.m_RealWorldTime )      return false;
    if( m_ui8Reason                            != Value.m_ui8Reason )          return false;
    if( m_ui8FrozenBehaviour                   != Value.m_ui8FrozenBehaviour ) return false;
    if( m_ui32RequestID                        != Value.m_ui32RequestID )      return false;
    return true;
}